

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

bool __thiscall xatlas::internal::BitImage::get(BitImage *this,uint32_t x,uint32_t y)

{
  uint uVar1;
  
  if ((x < this->m_width) && (y < this->m_height)) {
    uVar1 = y * this->m_rowStride + (x >> 6);
    if (uVar1 < (this->m_data).m_base.size) {
      return (*(ulong *)((this->m_data).m_base.buffer + (ulong)uVar1 * 8) >> ((ulong)x & 0x3f) & 1)
             != 0;
    }
    __assert_fail("index < m_base.size",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x4a8,
                  "const T &xatlas::internal::Array<unsigned long>::operator[](uint32_t) const [T = unsigned long]"
                 );
  }
  __assert_fail("x < m_width && y < m_height",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x580,"bool xatlas::internal::BitImage::get(uint32_t, uint32_t) const");
}

Assistant:

bool get(uint32_t x, uint32_t y) const
	{
		XA_DEBUG_ASSERT(x < m_width && y < m_height);
		const uint32_t index = (x >> 6) + y * m_rowStride;
		return (m_data[index] & (UINT64_C(1) << (uint64_t(x) & UINT64_C(63)))) != 0;
	}